

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,inf_or_nan_writer *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  wchar_t __tmp;
  int *piVar8;
  char *pcVar9;
  size_t size;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  basic_buffer<wchar_t> *c;
  int iVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  uVar15 = (ulong)spec->width_;
  cVar7 = f->sign;
  uVar14 = 4 - (ulong)(cVar7 == '\0');
  puVar2 = *(undefined8 **)this;
  lVar12 = puVar2[2];
  uVar11 = uVar15 - uVar14;
  if (uVar15 < uVar14 || uVar11 == 0) {
    uVar14 = uVar14 + lVar12;
    if ((ulong)puVar2[3] < uVar14) {
      (**(code **)*puVar2)(puVar2,uVar14);
      cVar7 = f->sign;
    }
    puVar2[2] = uVar14;
    piVar10 = (int *)(lVar12 * 4 + puVar2[1]);
    if (cVar7 != '\0') {
      *piVar10 = (int)cVar7;
      piVar10 = piVar10 + 1;
    }
    pcVar9 = f->str;
    uVar11 = 4;
    lVar12 = 0;
    do {
      piVar10[lVar12] = (int)pcVar9[lVar12];
      uVar11 = uVar11 - 1;
      lVar12 = lVar12 + 1;
    } while (1 < uVar11);
  }
  else {
    uVar13 = lVar12 + uVar15;
    if ((ulong)puVar2[3] < uVar13) {
      (**(code **)*puVar2)(puVar2,uVar13);
    }
    puVar2[2] = uVar13;
    auVar6 = _DAT_00160db0;
    auVar5 = _DAT_0015d2a0;
    auVar4 = _DAT_0015d290;
    lVar3 = puVar2[1];
    piVar10 = (int *)(lVar3 + lVar12 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar13 = uVar11 >> 1;
      if (1 < uVar11) {
        piVar10 = piVar10 + uVar13;
        uVar11 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar26._8_4_ = (int)uVar11;
        auVar26._0_8_ = uVar11;
        auVar26._12_4_ = (int)(uVar11 >> 0x20);
        lVar3 = lVar3 + lVar12 * 4;
        lVar12 = 0;
        auVar26 = auVar26 ^ _DAT_0015d2a0;
        do {
          auVar23._8_4_ = (int)lVar12;
          auVar23._0_8_ = lVar12;
          auVar23._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar27 = (auVar23 | auVar4) ^ auVar5;
          iVar21 = auVar26._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar21 && auVar26._0_4_ < auVar27._0_4_ ||
                      iVar21 < auVar27._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar12 * 4) = wVar1;
          }
          if ((auVar27._12_4_ != auVar26._12_4_ || auVar27._8_4_ <= auVar26._8_4_) &&
              auVar27._12_4_ <= auVar26._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar12 * 4) = wVar1;
          }
          auVar23 = (auVar23 | auVar6) ^ auVar5;
          iVar28 = auVar23._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar23._0_4_ <= auVar26._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar12 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar12 * 4) = wVar1;
          }
          lVar12 = lVar12 + 4;
        } while ((uVar11 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar12);
      }
      if (f->sign != '\0') {
        *piVar10 = (int)f->sign;
        piVar10 = piVar10 + 1;
      }
      pcVar9 = f->str;
      uVar11 = 4;
      do {
        piVar8 = piVar10;
        *piVar8 = (int)*pcVar9;
        auVar6 = _DAT_00160db0;
        auVar5 = _DAT_0015d2a0;
        auVar4 = _DAT_0015d290;
        pcVar9 = pcVar9 + 1;
        uVar11 = uVar11 - 1;
        piVar10 = piVar8 + 1;
      } while (1 < uVar11);
      uVar14 = (uVar15 * 4 + (uVar14 + uVar13) * -4) - 4;
      auVar27._8_4_ = (int)uVar14;
      auVar27._0_8_ = uVar14;
      auVar27._12_4_ = (int)(uVar14 >> 0x20);
      auVar18._0_8_ = uVar14 >> 2;
      auVar18._8_8_ = auVar27._8_8_ >> 2;
      uVar11 = 0;
      auVar18 = auVar18 ^ _DAT_0015d2a0;
      do {
        auVar24._8_4_ = (int)uVar11;
        auVar24._0_8_ = uVar11;
        auVar24._12_4_ = (int)(uVar11 >> 0x20);
        auVar26 = (auVar24 | auVar4) ^ auVar5;
        iVar21 = auVar18._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar21 && auVar18._0_4_ < auVar26._0_4_ ||
                    iVar21 < auVar26._4_4_) & 1)) {
          (piVar8 + 1)[uVar11] = wVar1;
        }
        if ((auVar26._12_4_ != auVar18._12_4_ || auVar26._8_4_ <= auVar18._8_4_) &&
            auVar26._12_4_ <= auVar18._12_4_) {
          piVar8[uVar11 + 2] = wVar1;
        }
        auVar26 = (auVar24 | auVar6) ^ auVar5;
        iVar28 = auVar26._4_4_;
        if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar18._0_4_)) {
          piVar8[uVar11 + 3] = wVar1;
          piVar8[uVar11 + 4] = wVar1;
        }
        uVar11 = uVar11 + 4;
      } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      piVar10 = piVar10 + uVar11;
      uVar14 = (uVar15 * 4 + uVar14 * -4) - 4;
      auVar16._8_4_ = (int)uVar14;
      auVar16._0_8_ = uVar14;
      auVar16._12_4_ = (int)(uVar14 >> 0x20);
      auVar17._0_8_ = uVar14 >> 2;
      auVar17._8_8_ = auVar16._8_8_ >> 2;
      lVar3 = lVar3 + lVar12 * 4;
      uVar11 = 0;
      auVar17 = auVar17 ^ _DAT_0015d2a0;
      do {
        auVar22._8_4_ = (int)uVar11;
        auVar22._0_8_ = uVar11;
        auVar22._12_4_ = (int)(uVar11 >> 0x20);
        auVar26 = (auVar22 | auVar4) ^ auVar5;
        iVar21 = auVar17._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar21 && auVar17._0_4_ < auVar26._0_4_ ||
                    iVar21 < auVar26._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + uVar11 * 4) = wVar1;
        }
        if ((auVar26._12_4_ != auVar17._12_4_ || auVar26._8_4_ <= auVar17._8_4_) &&
            auVar26._12_4_ <= auVar17._12_4_) {
          *(wchar_t *)(lVar3 + 4 + uVar11 * 4) = wVar1;
        }
        auVar26 = (auVar22 | auVar6) ^ auVar5;
        iVar28 = auVar26._4_4_;
        if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar17._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + uVar11 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + uVar11 * 4) = wVar1;
        }
        uVar11 = uVar11 + 4;
      } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      if (f->sign != '\0') {
        *piVar10 = (int)f->sign;
        piVar10 = piVar10 + 1;
      }
      pcVar9 = f->str;
      uVar11 = 4;
      lVar12 = 0;
      do {
        piVar10[lVar12] = (int)pcVar9[lVar12];
        uVar11 = uVar11 - 1;
        lVar12 = lVar12 + 1;
      } while (1 < uVar11);
    }
    else {
      if (f->sign != '\0') {
        *piVar10 = (int)f->sign;
        piVar10 = piVar10 + 1;
      }
      pcVar9 = f->str;
      uVar11 = 4;
      do {
        piVar8 = piVar10;
        *piVar8 = (int)*pcVar9;
        auVar6 = _DAT_00160db0;
        auVar5 = _DAT_0015d2a0;
        auVar4 = _DAT_0015d290;
        pcVar9 = pcVar9 + 1;
        uVar11 = uVar11 - 1;
        piVar10 = piVar8 + 1;
      } while (1 < uVar11);
      uVar14 = (uVar15 * 4 + uVar14 * -4) - 4;
      auVar19._8_4_ = (int)uVar14;
      auVar19._0_8_ = uVar14;
      auVar19._12_4_ = (int)(uVar14 >> 0x20);
      auVar20._0_8_ = uVar14 >> 2;
      auVar20._8_8_ = auVar19._8_8_ >> 2;
      uVar11 = 0;
      auVar20 = auVar20 ^ _DAT_0015d2a0;
      do {
        auVar25._8_4_ = (int)uVar11;
        auVar25._0_8_ = uVar11;
        auVar25._12_4_ = (int)(uVar11 >> 0x20);
        auVar26 = (auVar25 | auVar4) ^ auVar5;
        iVar21 = auVar20._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar21 && auVar20._0_4_ < auVar26._0_4_ ||
                    iVar21 < auVar26._4_4_) & 1)) {
          (piVar8 + 1)[uVar11] = wVar1;
        }
        if ((auVar26._12_4_ != auVar20._12_4_ || auVar26._8_4_ <= auVar20._8_4_) &&
            auVar26._12_4_ <= auVar20._12_4_) {
          piVar8[uVar11 + 2] = wVar1;
        }
        auVar26 = (auVar25 | auVar6) ^ auVar5;
        iVar28 = auVar26._4_4_;
        if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar20._0_4_)) {
          piVar8[uVar11 + 3] = wVar1;
          piVar8[uVar11 + 4] = wVar1;
        }
        uVar11 = uVar11 + 4;
      } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }